

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionModel::ArchiveIN(ChCollisionModel *this,ChArchiveIn *marchive)

{
  char *local_38;
  float *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::collision::ChCollisionModel>(marchive);
  local_30 = &this->model_envelope;
  local_38 = "model_envelope";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->model_safe_margin;
  local_38 = "model_safe_margin";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  return;
}

Assistant:

void ChCollisionModel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChCollisionModel>();

    // stream in all member data:
    marchive >> CHNVP(model_envelope);
    marchive >> CHNVP(model_safe_margin);
}